

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O0

int CfdAddTapBranchByScriptTreeString(void *handle,void *tree_handle,char *tree_string)

{
  bool bVar1;
  byte bVar2;
  undefined8 uVar3;
  reference this;
  reference this_00;
  char *in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  value_type *dest_tree;
  value_type *branch;
  TapBranch add_branch;
  CfdCapiTapscriptTree *buffer;
  int result;
  size_type in_stack_fffffffffffffd98;
  TapBranch *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffdb0;
  CfdError in_stack_fffffffffffffdbc;
  uint uVar4;
  CfdException *in_stack_fffffffffffffdc0;
  TapBranch local_1e8;
  string local_170 [24];
  undefined8 in_stack_fffffffffffffea8;
  void *in_stack_fffffffffffffeb0;
  allocator local_141;
  string local_140;
  TapBranch local_120;
  long local_a8;
  undefined1 local_9a;
  allocator local_99;
  string local_98 [32];
  CfdSourceLocation local_78;
  allocator local_59;
  string local_58 [52];
  undefined4 local_24;
  char *local_20;
  long local_18;
  int local_4;
  
  local_24 = 0xffffffff;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"TapscriptTree",&local_59);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffeb0,(string *)in_stack_fffffffffffffea8);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_78.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_script.cpp"
                 ,0x2f);
    local_78.filename = local_78.filename + 1;
    local_78.line = 0x2f3;
    local_78.funcname = "CfdAddTapBranchByScriptTreeString";
    cfd::core::logger::warn<>(&local_78,"tree_string is null or empty.");
    local_9a = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,"Failed to parameter. tree_string is null or empty.",&local_99);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb0);
    local_9a = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_a8 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,local_20,&local_141);
  cfd::core::TapBranch::FromString(&local_120,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  bVar1 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::empty
                    (*(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
                      (local_a8 + 0x18));
  if (bVar1) {
    this_00 = std::
              vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
              at((vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                  *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    cfd::core::TaprootScriptTree::AddBranch(this_00,&local_120);
  }
  else {
    this = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at
                     ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
                      in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    cfd::core::TapBranch::ToString_abi_cxx11_((string *)local_170,this);
    bVar2 = std::__cxx11::string::empty();
    uVar4 = (uint)bVar2 << 0x18;
    std::__cxx11::string::~string(local_170);
    if ((uVar4 & 0x1000000) == 0) {
      cfd::core::TapBranch::AddBranch(this,&local_120);
    }
    else {
      cfd::core::TapBranch::TapBranch(&local_1e8,&local_120);
      cfd::core::TapBranch::operator=(this,&local_1e8);
      cfd::core::TapBranch::~TapBranch(in_stack_fffffffffffffda0);
    }
  }
  local_4 = 0;
  cfd::core::TapBranch::~TapBranch(in_stack_fffffffffffffda0);
  return local_4;
}

Assistant:

int CfdAddTapBranchByScriptTreeString(
    void* handle, void* tree_handle, const char* tree_string) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    if (IsEmptyString(tree_string)) {
      warn(CFD_LOG_SOURCE, "tree_string is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tree_string is null or empty.");
    }
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);

    TapBranch add_branch = TapBranch::FromString(tree_string);
    if (!buffer->branch_buffer->empty()) {
      auto& branch = buffer->branch_buffer->at(0);
      if (branch.ToString().empty()) {
        branch = TapBranch(add_branch);  // override
      } else {
        branch.AddBranch(add_branch);
      }
    } else {
      auto& dest_tree = buffer->tree_buffer->at(0);
      dest_tree.AddBranch(add_branch);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}